

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O1

void aros_setlnksym(GlobalVars *gv,Symbol *xdef)

{
  LinkedSection *pLVar1;
  
  if (((xdef->flags & 1) != 0) && ((int)xdef->extra < 0)) {
    if ((xdef->extra & 0x7fffffff) == 0) {
      pLVar1 = smalldata_section(gv);
      xdef->relsect = (Section *)(pLVar1->sections).first;
    }
    xdef->flags = xdef->flags & 0xfe;
    return;
  }
  elf_setlnksym(gv,xdef);
  return;
}

Assistant:

static void aros_setlnksym(struct GlobalVars *gv,struct Symbol *xdef)
{
  if ((xdef->flags & SYMF_LNKSYM) && (xdef->extra & SYMX_SPECIAL)) {
    struct LinkedSection *ls;

    switch (xdef->extra & ~SYMX_SPECIAL) {
      case LINKERDB:
        ls = smalldata_section(gv);
        xdef->relsect = (struct Section *)ls->sections.first;
        break;
    }
    xdef->flags &= ~SYMF_LNKSYM;  /* do not init again */
  }
  else
    elf_setlnksym(gv,xdef);
}